

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

bool __thiscall libtorrent::aux::torrent::should_announce_dht(torrent *this)

{
  element_type *peVar1;
  node_ptr plVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  if (((this->field_0x5cc & 0x20) != 0) &&
     (iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x45])(), (char)iVar4 != '\0')) {
    if ((char)this->field_0x5cc < '\0') {
      iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x2e])();
      bVar3 = session_settings::get_bool((session_settings *)CONCAT44(extraout_var,iVar4),0x8017);
      if (!bVar3) {
        return false;
      }
    }
    iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x49])();
    if (CONCAT44(extraout_var_00,iVar4) != 0) {
      peVar1 = (this->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar4 = (peVar1->m_files).m_piece_length;
      if ((((iVar4 < 1) || ((this->field_0x5c0 & 8) != 0)) && ((this->field_0x5e0 & 1) != 0)) &&
         ((((this->super_torrent_hot_members).field_0x4b & 8) == 0 &&
          ((iVar4 < 1 || (((peVar1->m_flags).m_val & 2) == 0)))))) {
        plVar2 = (this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.super_node.
                 next_;
        if (plVar2 == &(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.
                       super_node || plVar2 == (node_ptr)0x0) {
          return true;
        }
        iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[0x2e])();
        bVar3 = session_settings::get_bool
                          ((session_settings *)CONCAT44(extraout_var_01,iVar4),0x8004);
        if (bVar3) {
          bVar3 = tracker_list::any_verified(&this->m_trackers);
          return !bVar3;
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool torrent::should_announce_dht() const
	{
		TORRENT_ASSERT(is_single_thread());
		if (!m_enable_dht) return false;
		if (!m_ses.announce_dht()) return false;

#if TORRENT_USE_I2P
		// i2p torrents don't announced on the DHT
		// unless we allow mixed swarms
		if (is_i2p() && !settings().get_bool(settings_pack::allow_i2p_mixed))
			return false;
#endif

		if (!m_ses.dht()) return false;
		if (m_torrent_file->is_valid() && !m_files_checked) return false;
		if (!m_announce_to_dht) return false;
		if (m_paused) return false;

		// don't announce private torrents
		if (m_torrent_file->is_valid() && m_torrent_file->priv()) return false;
		if (m_trackers.empty()) return true;
		if (!settings().get_bool(settings_pack::use_dht_as_fallback)) return true;

		return !m_trackers.any_verified();
	}